

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::replaceWithLogicalBasis(HModel *this)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  
  if (0 < this->numRow) {
    piVar2 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      iVar1 = this->numCol;
      piVar3[iVar1 + lVar4] = 0;
      piVar2[lVar4] = (int)lVar4 + iVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->numRow);
  }
  if (0 < this->numCol) {
    piVar2 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      piVar2[lVar4] = 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->numCol);
  }
  this->numBasicLogicals = this->numRow;
  populate_WorkArrays(this);
  mlFg_Update(this,this->mlFg_action_NewBasis);
  return;
}

Assistant:

void HModel::replaceWithLogicalBasis() {
  // Replace basis with a logical basis then populate (where possible)
  // work* arrays
  for (int row = 0; row < numRow; row++) {
    int var = numCol + row;
    nonbasicFlag[var] = NONBASIC_FLAG_FALSE;
    basicIndex[row] = var;
  }
  for (int col = 0; col < numCol; col++) {
    nonbasicFlag[col] = NONBASIC_FLAG_TRUE;
  }
  numBasicLogicals = numRow;

  populate_WorkArrays();

  //Deduce the consequences of a new basis
  mlFg_Update(mlFg_action_NewBasis);
}